

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::checkmesh(tetgenmesh *this,int topoflag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  point pdVar6;
  point pb_00;
  point pc_00;
  point pd_00;
  point pdVar7;
  char *pcVar8;
  double dVar9;
  int local_78;
  uint local_74;
  int i;
  int horrors;
  double ori;
  point pd;
  point pc;
  point pb;
  point pa;
  triface symtet;
  triface neightet;
  triface tetloop;
  int topoflag_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&symtet.ver);
  triface::triface((triface *)&pa);
  if (this->b->quiet == 0) {
    printf("  Checking consistency of mesh...\n");
  }
  local_74 = 0;
  memorypool::traversalinit(this->tetrahedrons);
  neightet._8_8_ = alltetrahedrontraverse(this);
  while (neightet._8_8_ != 0) {
    for (tetloop.tet._0_4_ = 0; (int)tetloop.tet < 4; tetloop.tet._0_4_ = (int)tetloop.tet + 1) {
      pdVar6 = org(this,(triface *)&neightet.ver);
      pb_00 = dest(this,(triface *)&neightet.ver);
      pc_00 = apex(this,(triface *)&neightet.ver);
      pd_00 = oppo(this,(triface *)&neightet.ver);
      if ((int)tetloop.tet == 0) {
        bVar1 = ishulltet(this,(triface *)&neightet.ver);
        if (((!bVar1) && (topoflag == 0)) &&
           (dVar9 = orient3d(pdVar6,pb_00,pc_00,pd_00), 0.0 <= dVar9)) {
          pcVar8 = "Degenerated";
          if (0.0 < dVar9) {
            pcVar8 = "Inverted";
          }
          printf("  !! !! %s ",pcVar8);
          uVar2 = pointmark(this,pdVar6);
          uVar3 = pointmark(this,pb_00);
          uVar4 = pointmark(this,pc_00);
          uVar5 = pointmark(this,pd_00);
          printf("  (%d, %d, %d, %d) (ori = %.17g)\n",dVar9,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                 (ulong)uVar5);
          local_74 = local_74 + 1;
        }
        bVar1 = infected(this,(triface *)&neightet.ver);
        if (bVar1) {
          uVar2 = pointmark(this,pdVar6);
          uVar3 = pointmark(this,pb_00);
          uVar4 = pointmark(this,pc_00);
          uVar5 = pointmark(this,pd_00);
          printf("  !! (%d, %d, %d, %d) is infected.\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                 (ulong)uVar5);
          local_74 = local_74 + 1;
        }
        bVar1 = marktested(this,(triface *)&neightet.ver);
        if (bVar1) {
          uVar2 = pointmark(this,pdVar6);
          uVar3 = pointmark(this,pb_00);
          uVar4 = pointmark(this,pc_00);
          uVar5 = pointmark(this,pd_00);
          printf("  !! (%d, %d, %d, %d) is marked.\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                 (ulong)uVar5);
          local_74 = local_74 + 1;
        }
      }
      if (*(long *)(neightet._8_8_ + (long)(int)tetloop.tet * 8) == 0) {
        uVar2 = pointmark(this,pdVar6);
        uVar3 = pointmark(this,pb_00);
        uVar4 = pointmark(this,pc_00);
        printf("  !! !! No neighbor at face (%d, %d, %d).\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4)
        ;
        local_74 = local_74 + 1;
      }
      else {
        fsym(this,(triface *)&neightet.ver,(triface *)&symtet.ver);
        if (symtet._8_8_ == 0) {
          uVar2 = pointmark(this,pdVar6);
          uVar3 = pointmark(this,pb_00);
          uVar4 = pointmark(this,pc_00);
          uVar5 = pointmark(this,pd_00);
          printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",(ulong)uVar2,(ulong)uVar3,
                 (ulong)uVar4,(ulong)uVar5);
          local_74 = local_74 + 1;
        }
        else {
          fsym(this,(triface *)&symtet.ver,(triface *)&pa);
          if (((point)neightet._8_8_ != pa) || ((int)tetloop.tet != (int)symtet.tet)) {
            printf("  !! !! Asymmetric tetra-tetra bond:\n");
            if ((point)neightet._8_8_ == pa) {
              printf("   (Right tetrahedron, wrong orientation)\n");
            }
            uVar2 = pointmark(this,pdVar6);
            uVar3 = pointmark(this,pb_00);
            uVar4 = pointmark(this,pc_00);
            uVar5 = pointmark(this,pd_00);
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            pdVar7 = org(this,(triface *)&symtet.ver);
            uVar2 = pointmark(this,pdVar7);
            pdVar7 = dest(this,(triface *)&symtet.ver);
            uVar3 = pointmark(this,pdVar7);
            pdVar7 = apex(this,(triface *)&symtet.ver);
            uVar4 = pointmark(this,pdVar7);
            pdVar7 = oppo(this,(triface *)&symtet.ver);
            uVar5 = pointmark(this,pdVar7);
            printf("    Second: (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            local_74 = local_74 + 1;
          }
          pdVar7 = org(this,(triface *)&symtet.ver);
          if ((pdVar7 != pb_00) || (pdVar7 = dest(this,(triface *)&symtet.ver), pdVar7 != pdVar6)) {
            printf("  !! !! Wrong edge-edge bond:\n");
            uVar2 = pointmark(this,pdVar6);
            uVar3 = pointmark(this,pb_00);
            uVar4 = pointmark(this,pc_00);
            uVar5 = pointmark(this,pd_00);
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            pdVar7 = org(this,(triface *)&symtet.ver);
            uVar2 = pointmark(this,pdVar7);
            pdVar7 = dest(this,(triface *)&symtet.ver);
            uVar3 = pointmark(this,pdVar7);
            pdVar7 = apex(this,(triface *)&symtet.ver);
            uVar4 = pointmark(this,pdVar7);
            pdVar7 = oppo(this,(triface *)&symtet.ver);
            uVar5 = pointmark(this,pdVar7);
            printf("    Second: (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            local_74 = local_74 + 1;
          }
          pdVar7 = apex(this,(triface *)&symtet.ver);
          if (pdVar7 != pc_00) {
            printf("  !! !! Wrong face-face bond:\n");
            uVar2 = pointmark(this,pdVar6);
            uVar3 = pointmark(this,pb_00);
            uVar4 = pointmark(this,pc_00);
            uVar5 = pointmark(this,pd_00);
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            pdVar7 = org(this,(triface *)&symtet.ver);
            uVar2 = pointmark(this,pdVar7);
            pdVar7 = dest(this,(triface *)&symtet.ver);
            uVar3 = pointmark(this,pdVar7);
            pdVar7 = apex(this,(triface *)&symtet.ver);
            uVar4 = pointmark(this,pdVar7);
            pdVar7 = oppo(this,(triface *)&symtet.ver);
            uVar5 = pointmark(this,pdVar7);
            printf("    Second: (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            local_74 = local_74 + 1;
          }
          pdVar7 = oppo(this,(triface *)&symtet.ver);
          if (pdVar7 == pd_00) {
            printf("  !! !! Two identical tetra:\n");
            uVar2 = pointmark(this,pdVar6);
            uVar3 = pointmark(this,pb_00);
            uVar4 = pointmark(this,pc_00);
            uVar5 = pointmark(this,pd_00);
            printf("    First:  (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            pdVar7 = org(this,(triface *)&symtet.ver);
            uVar2 = pointmark(this,pdVar7);
            pdVar7 = dest(this,(triface *)&symtet.ver);
            uVar3 = pointmark(this,pdVar7);
            pdVar7 = apex(this,(triface *)&symtet.ver);
            uVar4 = pointmark(this,pdVar7);
            pdVar7 = oppo(this,(triface *)&symtet.ver);
            uVar5 = pointmark(this,pdVar7);
            printf("    Second: (%d, %d, %d, %d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                   (ulong)uVar5);
            local_74 = local_74 + 1;
          }
        }
      }
      bVar1 = facemarked(this,(triface *)&neightet.ver);
      if (bVar1) {
        uVar2 = pointmark(this,pdVar6);
        uVar3 = pointmark(this,pb_00);
        uVar4 = pointmark(this,pc_00);
        uVar5 = pointmark(this,pd_00);
        printf("  !! tetface (%d, %d, %d) %d is marked.\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (ulong)uVar5);
      }
    }
    for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
      bVar1 = edgemarked(this,(triface *)&neightet.ver);
      if (bVar1) {
        pdVar6 = org(this,(triface *)&neightet.ver);
        uVar2 = pointmark(this,pdVar6);
        pdVar6 = dest(this,(triface *)&neightet.ver);
        uVar3 = pointmark(this,pdVar6);
        pdVar6 = apex(this,(triface *)&neightet.ver);
        uVar4 = pointmark(this,pdVar6);
        pdVar6 = oppo(this,(triface *)&neightet.ver);
        uVar5 = pointmark(this,pdVar6);
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (ulong)uVar5);
      }
    }
    neightet._8_8_ = alltetrahedrontraverse(this);
  }
  if (local_74 == 0) {
    if (this->b->quiet == 0) {
      printf("  In my studied opinion, the mesh appears to be consistent.\n");
    }
  }
  else {
    pcVar8 = "abnormities";
    if (1 < (int)local_74) {
      pcVar8 = "abnormity";
    }
    printf("  !! !! !! !! %d %s witnessed.\n",(ulong)local_74,pcVar8);
  }
  return local_74;
}

Assistant:

int tetgenmesh::checkmesh(int topoflag)
{
  triface tetloop, neightet, symtet;
  point pa, pb, pc, pd;
  REAL ori;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of mesh...\n");
  }

  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of tetrahedra, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = alltetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      pa = org(tetloop);
      pb = dest(tetloop);
      pc = apex(tetloop);
      pd = oppo(tetloop);
      if (tetloop.ver == 0) {  // Only test for inversion once.
        if (!ishulltet(tetloop)) {  // Only do test if it is not a hull tet.
          if (!topoflag) {
            ori = orient3d(pa, pb, pc, pd);
            if (ori >= 0.0) {
              printf("  !! !! %s ", ori > 0.0 ? "Inverted" : "Degenerated");
              printf("  (%d, %d, %d, %d) (ori = %.17g)\n", pointmark(pa),
                     pointmark(pb), pointmark(pc), pointmark(pd), ori);
              horrors++;
            }
          }
        }
        if (infected(tetloop)) { 
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is infected.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
        if (marktested(tetloop)) {
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is marked.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (tetloop.tet[tetloop.ver] == NULL) {
        printf("  !! !! No neighbor at face (%d, %d, %d).\n", pointmark(pa),
               pointmark(pb), pointmark(pc));
        horrors++;
      } else {
        // Find the neighboring tetrahedron on this face.
        fsym(tetloop, neightet);
        if (neightet.tet != NULL) {
          // Check that the tetrahedron's neighbor knows it's a neighbor.
          fsym(neightet, symtet);
          if ((tetloop.tet != symtet.tet) || (tetloop.ver != symtet.ver)) {
            printf("  !! !! Asymmetric tetra-tetra bond:\n");
            if (tetloop.tet == symtet.tet) {
              printf("   (Right tetrahedron, wrong orientation)\n");
            }
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same edge (the bond() operation).
          if ((org(neightet) != pb) || (dest(neightet) != pa)) {
            printf("  !! !! Wrong edge-edge bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same apex.
          if (apex(neightet) != pc) {
            printf("  !! !! Wrong face-face bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same opposite.
          if (oppo(neightet) == pd) {
            printf("  !! !! Two identical tetra:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
        } else {
          printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",
                 pointmark(pa), pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (facemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetface (%d, %d, %d) %d is marked.\n", pointmark(pa),
               pointmark(pb), pointmark(pc), pointmark(pd));
      }
    }
    // Check the six edges of this tet.
    for (i = 0; i < 6; i++) {
      tetloop.ver = edge2ver[i];
      if (edgemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n", 
               pointmark(org(tetloop)), pointmark(dest(tetloop)), 
               pointmark(apex(tetloop)), pointmark(oppo(tetloop)));
      }
    }
    tetloop.tet = alltetrahedrontraverse();
  }
  if (horrors == 0) {
    if (!b->quiet) {
      printf("  In my studied opinion, the mesh appears to be consistent.\n");
    }
  } else {
    printf("  !! !! !! !! %d %s witnessed.\n", horrors, 
           horrors > 1 ? "abnormity" : "abnormities");
  }

  return horrors;
}